

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsocket.c
# Opt level: O1

int mg_socket_connect(int sock,sockaddr *addr,socklen_t addrlen)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  do {
    iVar1 = connect(sock,(sockaddr *)addr,addrlen);
    if (iVar1 != -1) break;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  iVar2 = -100;
  if (iVar1 != -1) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mg_socket_connect(int sock, const struct sockaddr *addr,
                      socklen_t addrlen) {
  long status = MG_RETRY_ON_EINTR(connect(sock, addr, addrlen));
  if (mg_socket_test_status_is_error(status)) {
    return MG_ERROR_SOCKET;
  }
#ifdef __EMSCRIPTEN__
  if (mg_wasm_suspend_until_ready_to_write(sock) == -1) {
    return MG_ERROR_SOCKET;
  }
#endif

  return MG_SUCCESS;
}